

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::FromVectorToVariables
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChVariables *pCVar3;
  int iVar4;
  int n;
  size_t iv;
  long lVar5;
  ChVectorRef local_80;
  Type local_68;
  
  iVar4 = (*this->_vptr_ChSystemDescriptor[7])();
  if ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)iVar4) {
    ppCVar1 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppCVar2 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (lVar5 = 0; (long)ppCVar1 - (long)ppCVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
      pCVar3 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
      if (pCVar3->disabled == false) {
        iVar4 = pCVar3->offset;
        n = (*pCVar3->_vptr_ChVariables[2])();
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                  (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)mvector,
                   (long)iVar4,n);
        ChVariables::Get_qb(&local_80,
                            (this->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar5]);
        Eigen::internal::
        call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_80,
                   &local_68.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>
                  );
      }
    }
    return this->n_q;
  }
  __assert_fail("CountActiveVariables() == mvector.rows()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                ,0x17c,
                "virtual int chrono::ChSystemDescriptor::FromVectorToVariables(const ChVectorDynamic<> &)"
               );
}

Assistant:

int ChSystemDescriptor::FromVectorToVariables(const ChVectorDynamic<>& mvector) {
    assert(CountActiveVariables() == mvector.rows());

    // fetch from the vector
    auto vv_size = vvariables.size();
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->Get_qb() = mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof());
        }
    }

    return n_q;
}